

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

char * __thiscall
gl4cts::anon_unknown_0::ShaderStorageBufferObjectBase::GLenumToString
          (ShaderStorageBufferObjectBase *this,GLenum e)

{
  switch((int)this) {
  case 0x90d3:
    return "GL_SHADER_STORAGE_BUFFER_BINDING";
  case 0x90d4:
    return "GL_SHADER_STORAGE_BUFFER_START";
  case 0x90d5:
    return "GL_SHADER_STORAGE_BUFFER_SIZE";
  case 0x90d6:
    return "GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS";
  case 0x90d7:
    return "GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS";
  case 0x90d8:
    return "GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS";
  case 0x90d9:
    return "GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS";
  case 0x90da:
    return "GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS";
  case 0x90db:
    return "GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS";
  case 0x90dc:
    return "GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS";
  case 0x90dd:
    return "GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS";
  case 0x90de:
    return "GL_MAX_SHADER_STORAGE_BLOCK_SIZE";
  case 0x90df:
    return "GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT";
  }
  if ((int)this != 0x8f39) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderStorageBufferObjectTests.cpp"
                  ,0x25a,
                  "const char *gl4cts::(anonymous namespace)::ShaderStorageBufferObjectBase::GLenumToString(GLenum)"
                 );
  }
  return "GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES";
}

Assistant:

const char* GLenumToString(GLenum e)
	{
		switch (e)
		{
		case GL_SHADER_STORAGE_BUFFER_BINDING:
			return "GL_SHADER_STORAGE_BUFFER_BINDING";
		case GL_SHADER_STORAGE_BUFFER_START:
			return "GL_SHADER_STORAGE_BUFFER_START";
		case GL_SHADER_STORAGE_BUFFER_SIZE:
			return "GL_SHADER_STORAGE_BUFFER_SIZE";
		case GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS";
		case GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS";
		case GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS";
		case GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS";
		case GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS";
		case GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS";
		case GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS";
		case GL_MAX_SHADER_STORAGE_BLOCK_SIZE:
			return "GL_MAX_SHADER_STORAGE_BLOCK_SIZE";
		case GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS:
			return "GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS";
		case GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES:
			return "GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES";
		case GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT:
			return "GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT";

		default:
			assert(0);
			break;
		}
		return NULL;
	}